

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void csvStats(ostream *out,list<runData,_std::allocator<runData>_> *data,bool outputSizeData,
             int timing)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  char *pcVar2;
  _List_node_base *p_Var3;
  double dVar4;
  string compName;
  runData run;
  string local_50;
  
  std::operator<<(out,"file name");
  if (CONCAT31(in_register_00000011,outputSizeData) == 0) {
    pcVar2 = ",compression,pixel mode";
  }
  else {
    std::operator<<(out,",input size,pixel count,channel count,tile count,raw size");
    std::operator<<(out,",compression,pixel mode");
    pcVar2 = ",output size";
  }
  std::operator<<(out,pcVar2);
  if ((timing & 1U) != 0) {
    std::operator<<(out,",count read time");
    std::operator<<(out,",read time");
  }
  if ((timing & 2U) != 0) {
    std::operator<<(out,",write time");
  }
  if ((timing & 4U) != 0) {
    std::operator<<(out,",count reread time");
    std::operator<<(out,",reread time");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  p_Var3 = (_List_node_base *)data;
  while (p_Var3 = (((_List_base<runData,_std::allocator<runData>_> *)&p_Var3->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)data) {
    runData::runData(&run,(runData *)(p_Var3 + 1));
    std::operator<<(out,run.file);
    if (outputSizeData) {
      poVar1 = std::operator<<(out,',');
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,',');
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,',');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      if (run.metrics.totalStats.sizeData.isTiled == true) {
        poVar1 = std::operator<<(out,',');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      }
      else {
        std::operator<<(out,",---");
      }
      poVar1 = std::operator<<(out,',');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    compName._M_dataplus._M_p = (pointer)&compName.field_2;
    compName._M_string_length = 0;
    compName.field_2._M_local_buf[0] = '\0';
    if (run.compression == NUM_COMPRESSION_METHODS) {
      std::__cxx11::string::assign((char *)&compName);
    }
    else {
      Imf_3_4::getCompressionNameFromId(run.compression,(string *)&compName);
    }
    poVar1 = std::operator<<(out,',');
    poVar1 = std::operator<<(poVar1,(string *)&compName);
    poVar1 = std::operator<<(poVar1,',');
    modeName_abi_cxx11_(&local_50,run.mode);
    std::operator<<(poVar1,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (outputSizeData) {
      poVar1 = std::operator<<(out,',');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    if ((timing & 1U) != 0) {
      if (run.metrics.totalStats.sizeData.isDeep == true) {
        std::operator<<(out,',');
        dVar4 = median(&run.metrics.totalStats.countReadPerf);
        std::ostream::_M_insert<double>(dVar4);
      }
      else {
        std::operator<<(out,",---");
      }
      std::operator<<(out,',');
      dVar4 = median(&run.metrics.totalStats.readPerf);
      std::ostream::_M_insert<double>(dVar4);
    }
    if ((timing & 2U) != 0) {
      std::operator<<(out,',');
      dVar4 = median(&run.metrics.totalStats.writePerf);
      std::ostream::_M_insert<double>(dVar4);
    }
    if ((timing & 4U) != 0) {
      if (run.metrics.totalStats.sizeData.isDeep == true) {
        std::operator<<(out,',');
        dVar4 = median(&run.metrics.totalStats.countRereadPerf);
        std::ostream::_M_insert<double>(dVar4);
      }
      else {
        std::operator<<(out,",---");
      }
      std::operator<<(out,',');
      dVar4 = median(&run.metrics.totalStats.rereadPerf);
      std::ostream::_M_insert<double>(dVar4);
    }
    std::operator<<(out,"\n");
    std::__cxx11::string::~string((string *)&compName);
    fileMetrics::~fileMetrics(&run.metrics);
  }
  return;
}

Assistant:

void
csvStats (ostream& out, list<runData>& data, bool outputSizeData, int timing)
{
    out << "file name";
    if (outputSizeData)
    {
        out << ",input size,pixel count,channel count,tile count,raw size";
    }
    out << ",compression,pixel mode";
    if (outputSizeData) { out << ",output size"; }
    if (timing & options::TIME_READ)
    {
        out << ",count read time";
        out << ",read time";
    }
    if (timing & options::TIME_WRITE) { out << ",write time"; }
    if (timing & options::TIME_REREAD)
    {
        out << ",count reread time";
        out << ",reread time";
    }
    cout << "\n";
    for (runData run: data)
    {
        out << run.file;
        if (outputSizeData)
        {
            out << ',' << run.metrics.inputFileSize << ','
                << run.metrics.totalStats.sizeData.pixelCount << ','
                << run.metrics.totalStats.sizeData.channelCount;
            if (run.metrics.totalStats.sizeData.isTiled)
            {
                out << ',' << run.metrics.totalStats.sizeData.tileCount;
            }
            else { out << ",---"; }
            out << ',' << run.metrics.totalStats.sizeData.rawSize;
        }
        string compName;
        if (run.compression == NUM_COMPRESSION_METHODS)
        {
            compName = "original";
        }
        else { getCompressionNameFromId (run.compression, compName); }
        out << ',' << compName << ',' << modeName (run.mode);

        if (outputSizeData) { out << ',' << run.metrics.outputFileSize; }
        if (timing & options::TIME_READ)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countReadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.readPerf);
        }
        if (timing & options::TIME_WRITE)
        {
            out << ',' << median (run.metrics.totalStats.writePerf);
        }
        if (timing & options::TIME_REREAD)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countRereadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.rereadPerf);
        }
        out << "\n";
    }
}